

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleUploadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  int iVar3;
  CURLcode CVar4;
  string *psVar5;
  undefined8 uVar6;
  long lVar7;
  FILE *__stream;
  unsigned_long uVar8;
  CURL_conflict *data;
  curl_slist *list;
  ostream *poVar9;
  char *pcVar10;
  string *h;
  pointer pbVar11;
  pointer pbVar12;
  ulong uVar13;
  bool bVar14;
  string err;
  cURLEasyGuard g_curl;
  cmFileCommandVectorOfChar chunkDebug;
  cmFileCommandVectorOfChar chunkResponse;
  string netrc_level;
  string filename;
  cURLProgressHelper helper;
  string logVar;
  string netrc_file;
  string userpwd;
  string statusVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string url;
  string local_360 [3];
  ios_base local_2f0 [264];
  long local_1e8;
  cURLEasyGuard local_1e0;
  vector<char,_std::allocator<char>_> local_1d8;
  vector<char,_std::allocator<char>_> local_1b8;
  ulong local_1a0;
  string local_198;
  string local_178;
  cURLProgressHelper local_158;
  string local_128;
  string local_108;
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  long *local_90 [2];
  long local_80 [2];
  char local_70;
  undefined7 uStack_6f;
  long local_60 [2];
  string local_50;
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x41) {
    local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360,"UPLOAD must be called with at least three arguments.","");
    cmCommand::SetError(&this->super_cmCommand,local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
      operator_delete(local_360[0]._M_dataplus._M_p,
                      CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                               local_360[0].field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  pcVar1 = pbVar12[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar1,pcVar1 + pbVar12[1]._M_string_length);
  local_90[0] = local_80;
  pcVar1 = pbVar12[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + pbVar12[2]._M_string_length);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_e8 = &local_d8;
  local_e0 = 0;
  local_d8 = 0;
  pcVar2 = (this->super_cmCommand).Makefile;
  local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"CMAKE_NETRC","");
  psVar5 = cmMakefile::GetSafeDefinition(pcVar2,local_360);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar1,pcVar1 + psVar5->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
    operator_delete(local_360[0]._M_dataplus._M_p,
                    CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                             local_360[0].field_2._M_local_buf[0]) + 1);
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"CMAKE_NETRC_FILE","");
  psVar5 = cmMakefile::GetSafeDefinition(pcVar2,local_360);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar1,pcVar1 + psVar5->_M_string_length);
  pbVar12 = pbVar12 + 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
    operator_delete(local_360[0]._M_dataplus._M_p,
                    CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                             local_360[0].field_2._M_local_buf[0]) + 1);
  }
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pbVar12 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1e8 = 0;
    lVar7 = 0;
    uVar13 = 0;
  }
  else {
    lVar7 = 0;
    local_1e8 = 0;
    local_1a0 = 0;
    do {
      iVar3 = std::__cxx11::string::compare((char *)pbVar12);
      if (iVar3 == 0) {
        pbVar12 = pbVar12 + 1;
        if (pbVar12 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_360,"UPLOAD missing time for TIMEOUT.","");
          cmCommand::SetError(&this->super_cmCommand,local_360);
          goto LAB_00235a1c;
        }
        lVar7 = atol((pbVar12->_M_dataplus)._M_p);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)pbVar12);
        if (iVar3 == 0) {
          pbVar12 = pbVar12 + 1;
          if (pbVar12 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_360,"UPLOAD missing time for INACTIVITY_TIMEOUT.","");
            cmCommand::SetError(&this->super_cmCommand,local_360);
            goto LAB_00235a1c;
          }
          local_1e8 = atol((pbVar12->_M_dataplus)._M_p);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)pbVar12);
          if (iVar3 == 0) {
            pbVar12 = pbVar12 + 1;
            if (pbVar12 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_360,"UPLOAD missing VAR for LOG.","");
              cmCommand::SetError(&this->super_cmCommand,local_360);
              goto LAB_00235a1c;
            }
            std::__cxx11::string::_M_assign((string *)&local_128);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)pbVar12);
            if (iVar3 == 0) {
              pbVar12 = pbVar12 + 1;
              if (pbVar12 ==
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
                local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_360,"UPLOAD missing VAR for STATUS.","");
                cmCommand::SetError(&this->super_cmCommand,local_360);
                goto LAB_00235a1c;
              }
              std::__cxx11::string::_M_assign((string *)&local_c8);
            }
            else {
              uVar6 = std::__cxx11::string::compare((char *)pbVar12);
              if ((int)uVar6 == 0) {
                local_1a0 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)pbVar12);
                if (iVar3 == 0) {
                  pbVar12 = pbVar12 + 1;
                  if (pbVar12 ==
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
                    local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_360,"UPLOAD missing file value for NETRC_FILE.","");
                    cmCommand::SetError(&this->super_cmCommand,local_360);
                    goto LAB_00235a1c;
                  }
                  std::__cxx11::string::_M_assign((string *)&local_108);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)pbVar12);
                  if (iVar3 == 0) {
                    pbVar12 = pbVar12 + 1;
                    if (pbVar12 ==
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
                      local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_360,"UPLOAD missing level value for NETRC.","");
                      cmCommand::SetError(&this->super_cmCommand,local_360);
                      goto LAB_00235a1c;
                    }
                    std::__cxx11::string::_M_assign((string *)&local_198);
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)pbVar12);
                    if (iVar3 == 0) {
                      pbVar12 = pbVar12 + 1;
                      if (pbVar12 ==
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
                        local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_360,"UPLOAD missing string for USERPWD.","");
                        cmCommand::SetError(&this->super_cmCommand,local_360);
                        goto LAB_00235a1c;
                      }
                      std::__cxx11::string::_M_assign((string *)&local_e8);
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)pbVar12);
                      if (iVar3 == 0) {
                        pbVar12 = pbVar12 + 1;
                        if (pbVar12 ==
                            (args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish) {
                          local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_360,"UPLOAD missing string for HTTPHEADER.","")
                          ;
                          cmCommand::SetError(&this->super_cmCommand,local_360);
                          goto LAB_00235a1c;
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back(&local_a8,pbVar12);
                      }
                      else {
                        local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_360,"Unexpected argument: ","");
                        std::__cxx11::string::_M_append
                                  ((char *)local_360,(ulong)(pbVar12->_M_dataplus)._M_p);
                        cmMakefile::IssueMessage
                                  ((this->super_cmCommand).Makefile,AUTHOR_WARNING,local_360);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
                          operator_delete(local_360[0]._M_dataplus._M_p,
                                          CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                                                   local_360[0].field_2._M_local_buf[0]) + 1);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      pbVar12 = pbVar12 + 1;
      uVar13 = local_1a0;
    } while (pbVar12 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  __stream = (FILE *)cmsys::SystemTools::Fopen(&local_178,"rb");
  if (__stream == (FILE *)0x0) {
    local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360,"UPLOAD cannot open file \'","");
    local_158.CurrentPercentage = (long)&local_158.Text;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_178._M_dataplus._M_p,
               local_178._M_dataplus._M_p + local_178._M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    std::__cxx11::string::_M_append((char *)local_360,local_158.CurrentPercentage);
    if ((string *)local_158.CurrentPercentage != &local_158.Text) {
      operator_delete((void *)local_158.CurrentPercentage,
                      (ulong)(local_158.Text._M_dataplus._M_p + 1));
    }
    cmCommand::SetError(&this->super_cmCommand,local_360);
LAB_00235a1c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
      operator_delete(local_360[0]._M_dataplus._M_p,
                      CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                               local_360[0].field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    uVar8 = cmsys::SystemTools::FileLength(&local_178);
    curl_global_init(3);
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      local_1e0.Easy = data;
      CVar4 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      if (CVar4 == CURLE_OK) {
        CVar4 = curl_easy_setopt(data,CURLOPT_UPLOAD,1);
        if (CVar4 != CURLE_OK) {
          local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_360,"UPLOAD cannot set upload flag: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_360);
          cmCommand::SetError(&this->super_cmCommand,local_360);
          goto LAB_00235991;
        }
        CVar4 = curl_easy_setopt(data,CURLOPT_URL,local_90[0]);
        if (CVar4 != CURLE_OK) {
          local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_360,"UPLOAD cannot set url: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_360);
          cmCommand::SetError(&this->super_cmCommand,local_360);
          goto LAB_00235991;
        }
        CVar4 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_803f25::cmWriteToMemoryCallback);
        if (CVar4 != CURLE_OK) {
          local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_360,"UPLOAD cannot set write function: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_360);
          cmCommand::SetError(&this->super_cmCommand,local_360);
          goto LAB_00235991;
        }
        CVar4 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_803f25::cmFileCommandCurlDebugCallback);
        if (CVar4 != CURLE_OK) {
          local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_360,"UPLOAD cannot set debug function: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_360);
          cmCommand::SetError(&this->super_cmCommand,local_360);
          goto LAB_00235991;
        }
        local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        CVar4 = curl_easy_setopt(data,CURLOPT_WRITEDATA);
        if (CVar4 == CURLE_OK) {
          CVar4 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&local_1d8);
          if (CVar4 != CURLE_OK) {
            local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_360,"UPLOAD cannot set debug data: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_360);
            cmCommand::SetError(&this->super_cmCommand,local_360);
            goto LAB_00235c9f;
          }
          CVar4 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
          if (CVar4 != CURLE_OK) {
            local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_360,"UPLOAD cannot set follow-redirect option: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_360);
            cmCommand::SetError(&this->super_cmCommand,local_360);
            goto LAB_00235c9f;
          }
          if ((local_128._M_string_length != 0) &&
             (CVar4 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar4 != CURLE_OK)) {
            local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_360,"UPLOAD cannot set verbose: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_360);
            cmCommand::SetError(&this->super_cmCommand,local_360);
            goto LAB_00235c9f;
          }
          if ((0 < lVar7) &&
             (CVar4 = curl_easy_setopt(data,CURLOPT_TIMEOUT,lVar7), CVar4 != CURLE_OK)) {
            local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_360,"UPLOAD cannot set timeout: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_360);
            cmCommand::SetError(&this->super_cmCommand,local_360);
            goto LAB_00235c9f;
          }
          if (0 < local_1e8) {
            curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
            curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,local_1e8);
          }
          anon_unknown.dwarf_803f25::cURLProgressHelper::cURLProgressHelper
                    (&local_158,this,"upload");
          if ((uVar13 & 1) == 0) {
LAB_00235f4d:
            CVar4 = curl_easy_setopt(data,CURLOPT_READDATA,__stream);
            if (CVar4 != CURLE_OK) {
              local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_360,"UPLOAD cannot set input file: ","");
              curl_easy_strerror(CVar4);
              std::__cxx11::string::append((char *)local_360);
              cmCommand::SetError(&this->super_cmCommand,local_360);
              goto LAB_00236007;
            }
            CVar4 = curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar8);
            if (CVar4 != CURLE_OK) {
              local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_360,"UPLOAD cannot set input file size: ","");
              curl_easy_strerror(CVar4);
              std::__cxx11::string::append((char *)local_360);
              cmCommand::SetError(&this->super_cmCommand,local_360);
              goto LAB_00236007;
            }
            if ((local_e0 != 0) &&
               (CVar4 = curl_easy_setopt(data,CURLOPT_USERPWD,local_e8), CVar4 != CURLE_OK)) {
              local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_360,"UPLOAD cannot set user password: ","");
              curl_easy_strerror(CVar4);
              std::__cxx11::string::append((char *)local_360);
              cmCommand::SetError(&this->super_cmCommand,local_360);
              goto LAB_00236007;
            }
            cmsys::SystemTools::UpperCase(local_360,&local_198);
            std::__cxx11::string::operator=((string *)&local_198,(string *)local_360);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
              operator_delete(local_360[0]._M_dataplus._M_p,
                              CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                                       local_360[0].field_2._M_local_buf[0]) + 1);
            }
            cmCurlSetNETRCOption(&local_50,data,&local_198,&local_108);
            pbVar12 = local_a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            bVar14 = local_50._M_string_length == 0;
            if (bVar14) {
              list = (curl_slist *)0x0;
              for (pbVar11 = local_a8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar12;
                  pbVar11 = pbVar11 + 1) {
                list = curl_slist_append(list,(pbVar11->_M_dataplus)._M_p);
              }
              curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
              CVar4 = curl_easy_perform(data);
              curl_slist_free_all(list);
              local_1e0.Easy = (CURL_conflict *)0x0;
              curl_easy_cleanup(data);
              if (local_c8._M_string_length != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
                poVar9 = (ostream *)std::ostream::operator<<(local_360,CVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\"",2);
                pcVar10 = curl_easy_strerror(CVar4);
                poVar9 = std::operator<<(poVar9,pcVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
                pcVar2 = (this->super_cmCommand).Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::AddDefinition(pcVar2,&local_c8,(char *)CONCAT71(uStack_6f,local_70));
                if ((long *)CONCAT71(uStack_6f,local_70) != local_60) {
                  operator_delete((long *)CONCAT71(uStack_6f,local_70),local_60[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
                std::ios_base::~ios_base(local_2f0);
              }
              curl_global_cleanup();
              fclose(__stream);
              if (local_128._M_string_length != 0) {
                local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
                local_360[0]._M_string_length = 0;
                local_360[0].field_2._M_local_buf[0] = '\0';
                if (local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_70 = '\0';
                  std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_1b8,&local_70)
                  ;
                  std::__cxx11::string::append((char *)local_360);
                  std::__cxx11::string::append((char *)local_360);
                  std::__cxx11::string::append((char *)local_360);
                }
                if (local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_70 = '\0';
                  std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_1d8,&local_70)
                  ;
                  std::__cxx11::string::append((char *)local_360);
                  std::__cxx11::string::append((char *)local_360);
                  std::__cxx11::string::append((char *)local_360);
                }
                cmMakefile::AddDefinition
                          ((this->super_cmCommand).Makefile,&local_128,local_360[0]._M_dataplus._M_p
                          );
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
                  operator_delete(local_360[0]._M_dataplus._M_p,
                                  CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                                           local_360[0].field_2._M_local_buf[0]) + 1);
                }
              }
            }
            else {
              cmCommand::SetError(&this->super_cmCommand,&local_50);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            CVar4 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
            if (CVar4 == CURLE_OK) {
              CVar4 = curl_easy_setopt(data,CURLOPT_PROGRESSFUNCTION,
                                       anon_unknown.dwarf_803f25::cmFileUploadProgressCallback);
              if (CVar4 == CURLE_OK) {
                CVar4 = curl_easy_setopt(data,CURLOPT_PROGRESSDATA,&local_158);
                if (CVar4 == CURLE_OK) goto LAB_00235f4d;
                local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_360,"UPLOAD cannot set progress data: ","");
                curl_easy_strerror(CVar4);
                std::__cxx11::string::append((char *)local_360);
                cmCommand::SetError(&this->super_cmCommand,local_360);
              }
              else {
                local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_360,"UPLOAD cannot set progress function: ","");
                curl_easy_strerror(CVar4);
                std::__cxx11::string::append((char *)local_360);
                cmCommand::SetError(&this->super_cmCommand,local_360);
              }
            }
            else {
              local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_360,"UPLOAD cannot set noprogress value: ","");
              curl_easy_strerror(CVar4);
              std::__cxx11::string::append((char *)local_360);
              cmCommand::SetError(&this->super_cmCommand,local_360);
            }
LAB_00236007:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
              operator_delete(local_360[0]._M_dataplus._M_p,
                              CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                                       local_360[0].field_2._M_local_buf[0]) + 1);
            }
            bVar14 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.Text._M_dataplus._M_p != &local_158.Text.field_2) {
            operator_delete(local_158.Text._M_dataplus._M_p,
                            local_158.Text.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_360,"UPLOAD cannot set write data: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_360);
          cmCommand::SetError(&this->super_cmCommand,local_360);
LAB_00235c9f:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
            operator_delete(local_360[0]._M_dataplus._M_p,
                            CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                                     local_360[0].field_2._M_local_buf[0]) + 1);
          }
          bVar14 = false;
        }
        if (local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      else {
        local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_360,"UPLOAD cannot set fail on error flag: ","");
        curl_easy_strerror(CVar4);
        std::__cxx11::string::append((char *)local_360);
        cmCommand::SetError(&this->super_cmCommand,local_360);
LAB_00235991:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
          operator_delete(local_360[0]._M_dataplus._M_p,
                          CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                                   local_360[0].field_2._M_local_buf[0]) + 1);
        }
        bVar14 = false;
      }
      anon_unknown.dwarf_803f25::cURLEasyGuard::~cURLEasyGuard(&local_1e0);
      goto LAB_00235a3a;
    }
    local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360,"UPLOAD error initializing curl.","");
    cmCommand::SetError(&this->super_cmCommand,local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
      operator_delete(local_360[0]._M_dataplus._M_p,
                      CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                               local_360[0].field_2._M_local_buf[0]) + 1);
    }
    fclose(__stream);
  }
  bVar14 = false;
LAB_00235a3a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  return bVar14;
}

Assistant:

bool cmFileCommand::HandleUploadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if (args.size() < 3) {
    this->SetError("UPLOAD must be called with at least three arguments.");
    return false;
  }
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;
  std::string userpwd;
  std::string netrc_level = this->Makefile->GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    this->Makefile->GetSafeDefinition("CMAKE_NETRC_FILE");

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        this->SetError("UPLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        this->SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        this->SetError("UPLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        this->SetError("UPLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = "Unexpected argument: ";
      err += *i;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    ++i;
  }

  // Open file for reading:
  //
  FILE* fin = cmsys::SystemTools::Fopen(filename, "rb");
  if (!fin) {
    std::string errStr = "UPLOAD cannot open file '";
    errStr += filename + "' for reading.";
    this->SetError(errStr);
    return false;
  }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

#  if defined(_WIN32)
  url = fix_file_url_windows(url);
#  endif

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    this->SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
  }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res =
    ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "UPLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "upload");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
  }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res =
    ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "UPLOAD cannot set user password: ");
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    this->SetError(netrc_option_err);
    return false;
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    std::ostringstream result;
    result << static_cast<int>(res) << ";\"" << ::curl_easy_strerror(res)
           << "\"";
    this->Makefile->AddDefinition(statusVar, result.str().c_str());
  }

  ::curl_global_cleanup();

  fclose(fin);
  fin = nullptr;

  if (!logVar.empty()) {
    std::string log;

    if (!chunkResponse.empty()) {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += chunkResponse.data();
      log += "\n";
    }

    if (!chunkDebug.empty()) {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += chunkDebug.data();
      log += "\n";
    }

    this->Makefile->AddDefinition(logVar, log.c_str());
  }

  return true;
#else
  this->SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}